

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayoutBase.cpp
# Opt level: O2

void __thiscall cursespp::LayoutBase::RemoveWindow(LayoutBase *this)

{
  IWindowPtr *in_RSI;
  
  RemoveWindow((LayoutBase *)&this[-1].super_Window.width,in_RSI);
  return;
}

Assistant:

bool LayoutBase::RemoveWindow(IWindowPtr window) {
    this->RemoveFocusable(window);

    std::vector<IWindowPtr>::iterator it = this->children.begin();
    for ( ; it != this->children.end(); it++) {
        if (*it == window) {
            (*it)->Hide();
            this->children.erase(it);
            return true;
        }
    }

    return false;
}